

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  ARKodeMem local_38;
  ARKodeERKStepMem local_30;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"erkStep_FullRHS",&local_38,&local_30);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (mode == 2) {
    iVar1 = (*local_30->f)(t,y,f,local_38->user_data);
    local_30->nfe = local_30->nfe + 1;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    if (mode == 1) {
      if (ABS(local_30->B->c[(long)local_30->stages + -1] + -1.0) <= 1e-10) {
        N_VScale(1.0,local_30->F[(long)local_30->stages + -1],*local_30->F);
        goto LAB_004cfc10;
      }
    }
    else if (mode != 0) {
      arkProcessError(local_38,-8,"ARKode::ERKStep","erkStep_FullRHS","Unknown full RHS mode");
      return -8;
    }
    iVar1 = (*local_30->f)(t,y,*local_30->F,local_38->user_data);
    local_30->nfe = local_30->nfe + 1;
    if (iVar1 == 0) {
LAB_004cfc10:
      N_VScale(1.0,*local_30->F,f);
      return 0;
    }
  }
  arkProcessError(local_38,-8,"ARKode::ERKStep","erkStep_FullRHS",
                  "At t = %lg, the right-hand side routine failed in an unrecoverable manner.",t);
  return -8;
}

Assistant:

int erkStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  booleantype recomputeRHS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vectors f(t,y) in F[0] for possible reuse
     in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call f */
    retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                      "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     If the method coefficients support it, we just copy the last stage RHS
     vectors to fill f instead of calling f(t,y).
     Copy the results to F[0] if the coefficients support it. */
  case ARK_FULLRHS_END:

    /* determine if explicit RHS function needs to be recomputed */
    recomputeRHS = SUNFALSE;
    if (SUNRabs(step_mem->B->c[step_mem->stages - 1] - ONE) > TINY)
      recomputeRHS = SUNTRUE;

    /* base RHS calls on recomputeRHS argument */
    if (recomputeRHS) {

      /* call f */
      retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                        "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }

    } else {
      N_VScale(ONE, step_mem->F[step_mem->stages-1], step_mem->F[0]);
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  /*  ARK_FULLRHS_OTHER: called for dense output in-between steps
      store the intermediate calculations in such a way as to not
      interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->f(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                      "erkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ERKStep",
                    "erkStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  return(ARK_SUCCESS);
}